

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O2

int SUNDlsMat_denseGEQRF
              (sunrealtype **a,sunindextype m,sunindextype n,sunrealtype *beta,sunrealtype *v)

{
  sunrealtype *psVar1;
  sunrealtype *psVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  sunindextype sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double __x;
  double dVar14;
  
  lVar9 = 0;
  lVar3 = 0;
  if (0 < n) {
    lVar3 = n;
  }
  lVar8 = 0;
  sVar6 = m;
  while( true ) {
    lVar5 = 0;
    if (0 < sVar6) {
      lVar5 = sVar6;
    }
    lVar11 = lVar8;
    if (lVar8 < n) {
      lVar11 = n;
    }
    if (lVar8 == lVar3) break;
    psVar1 = a[lVar8];
    dVar13 = psVar1[lVar8];
    *v = 1.0;
    lVar10 = m - lVar8;
    dVar14 = 0.0;
    for (lVar4 = 1; lVar4 < lVar10; lVar4 = lVar4 + 1) {
      dVar12 = *(double *)((long)psVar1 + lVar4 * 8 + lVar9);
      v[lVar4] = dVar12;
      dVar14 = dVar14 + dVar12 * dVar12;
    }
    lVar4 = lVar8;
    if ((dVar14 != 0.0) || (NAN(dVar14))) {
      __x = dVar13 * dVar13 + dVar14;
      dVar12 = 0.0;
      if (0.0 < __x) {
        if (__x < 0.0) {
          dVar12 = sqrt(__x);
        }
        else {
          dVar12 = SQRT(__x);
        }
      }
      dVar12 = (double)(-(ulong)(0.0 < dVar13) & (ulong)(-dVar14 / (dVar12 + dVar13)) |
                       ~-(ulong)(0.0 < dVar13) & (ulong)(dVar13 - dVar12));
      dVar13 = dVar12 * dVar12;
      beta[lVar8] = (dVar13 + dVar13) / (dVar14 + dVar13);
      for (lVar7 = 1; lVar7 < lVar10; lVar7 = lVar7 + 1) {
        v[lVar7] = v[lVar7] / dVar12;
      }
    }
    else {
      beta[lVar8] = 0.0;
    }
    for (; lVar4 != lVar11; lVar4 = lVar4 + 1) {
      psVar2 = a[lVar4];
      dVar13 = 0.0;
      for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
        dVar13 = dVar13 + *(double *)((long)psVar2 + lVar7 * 8 + lVar9) * v[lVar7];
      }
      dVar14 = beta[lVar8];
      for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
        *(double *)((long)psVar2 + lVar7 * 8 + lVar9) =
             v[lVar7] * -dVar13 * dVar14 + *(double *)((long)psVar2 + lVar7 * 8 + lVar9);
      }
    }
    if (lVar8 < m + -1) {
      for (lVar5 = 1; lVar5 < lVar10; lVar5 = lVar5 + 1) {
        *(sunrealtype *)((long)psVar1 + lVar5 * 8 + lVar9) = v[lVar5];
      }
    }
    lVar8 = lVar8 + 1;
    sVar6 = sVar6 + -1;
    lVar9 = lVar9 + 8;
  }
  return 0;
}

Assistant:

int SUNDlsMat_denseGEQRF(sunrealtype** a, sunindextype m, sunindextype n,
                         sunrealtype* beta, sunrealtype* v)
{
  sunrealtype ajj, s, mu, v1, v1_2;
  sunrealtype *col_j, *col_k;
  sunindextype i, j, k;

  /* For each column...*/
  for (j = 0; j < n; j++)
  {
    col_j = a[j];

    ajj = col_j[j];

    /* Compute the j-th Householder vector (of length m-j) */
    v[0] = ONE;
    s    = ZERO;
    for (i = 1; i < m - j; i++)
    {
      v[i] = col_j[i + j];
      s += v[i] * v[i];
    }

    if (s != ZERO)
    {
      mu      = SUNRsqrt(ajj * ajj + s);
      v1      = (ajj <= ZERO) ? ajj - mu : -s / (ajj + mu);
      v1_2    = v1 * v1;
      beta[j] = TWO * v1_2 / (s + v1_2);
      for (i = 1; i < m - j; i++) { v[i] /= v1; }
    }
    else { beta[j] = ZERO; }

    /* Update upper triangle of A (load R) */
    for (k = j; k < n; k++)
    {
      col_k = a[k];
      s     = ZERO;
      for (i = 0; i < m - j; i++) { s += col_k[i + j] * v[i]; }
      s *= beta[j];
      for (i = 0; i < m - j; i++) { col_k[i + j] -= s * v[i]; }
    }

    /* Update A (load Householder vector) */
    if (j < m - 1)
    {
      for (i = 1; i < m - j; i++) { col_j[i + j] = v[i]; }
    }
  }

  return (0);
}